

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O3

void evsig_cb(int fd,short what,void *arg)

{
  ssize_t sVar1;
  int *piVar2;
  long lVar3;
  int ncaught [65];
  int local_128 [68];
  
  memset(local_128,0,0x104);
  while (sVar1 = read(fd,evsig_cb::signals,0x400), sVar1 != -1) {
    if (sVar1 == 0) goto LAB_002d5cf2;
    if (0 < sVar1) {
      lVar3 = 0;
      do {
        if ((ulong)(byte)evsig_cb::signals[lVar3] < 0x41) {
          local_128[(byte)evsig_cb::signals[lVar3]] = local_128[(byte)evsig_cb::signals[lVar3]] + 1;
        }
        lVar3 = lVar3 + 1;
      } while (sVar1 != lVar3);
    }
  }
  piVar2 = __errno_location();
  if ((*piVar2 != 4) && (*piVar2 != 0xb)) {
    event_sock_err(1,fd,"%s: recv","evsig_cb");
  }
LAB_002d5cf2:
  if (*(void **)((long)arg + 0x1b0) != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,*(void **)((long)arg + 0x1b0));
  }
  lVar3 = 0;
  do {
    if (local_128[lVar3] != 0) {
      evmap_signal_active_((event_base *)arg,(int)lVar3,local_128[lVar3]);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x41);
  if (*(void **)((long)arg + 0x1b0) == (void *)0x0) {
    return;
  }
  (*evthread_lock_fns_.unlock)(0,*(void **)((long)arg + 0x1b0));
  return;
}

Assistant:

static void
evsig_cb(evutil_socket_t fd, short what, void *arg)
{
	static char signals[1024];
	ev_ssize_t n;
	int i;
	int ncaught[NSIG];
	struct event_base *base;

	base = arg;

	memset(&ncaught, 0, sizeof(ncaught));

	while (1) {
#ifdef _WIN32
		n = recv(fd, signals, sizeof(signals), 0);
#else
		n = read(fd, signals, sizeof(signals));
#endif
		if (n == -1) {
			int err = evutil_socket_geterror(fd);
			if (! EVUTIL_ERR_RW_RETRIABLE(err))
				event_sock_err(1, fd, "%s: recv", __func__);
			break;
		} else if (n == 0) {
			/* XXX warn? */
			break;
		}
		for (i = 0; i < n; ++i) {
			ev_uint8_t sig = signals[i];
			if (sig < NSIG)
				ncaught[sig]++;
		}
	}

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	for (i = 0; i < NSIG; ++i) {
		if (ncaught[i])
			evmap_signal_active_(base, i, ncaught[i]);
	}
	EVBASE_RELEASE_LOCK(base, th_base_lock);
}